

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# umutablecptrie.cpp
# Opt level: O2

int32_t __thiscall
icu_63::anon_unknown_0::MutableCodePointTrie::getDataBlock(MutableCodePointTrie *this,int32_t i)

{
  uint uVar1;
  uint32_t *puVar2;
  long lVar3;
  long lVar4;
  
  if (this->flags[i] == '\x01') {
    puVar2 = this->index;
  }
  else {
    if (0xfff < i) {
      uVar1 = allocDataBlock(this,0x10);
      if ((int)uVar1 < 0) {
        return uVar1;
      }
      writeBlock(this->data + uVar1,this->index[i]);
      this->flags[i] = '\x01';
      this->index[i] = uVar1;
      return uVar1;
    }
    uVar1 = allocDataBlock(this,0x40);
    if ((int)uVar1 < 0) {
      return uVar1;
    }
    puVar2 = this->index;
    lVar4 = (ulong)uVar1 << 2;
    lVar3 = (long)(int)(i & 0xfffffffc) + -1;
    do {
      writeBlock((uint32_t *)((long)this->data + lVar4),puVar2[lVar3 + 1]);
      this->flags[lVar3 + 1] = '\x01';
      puVar2 = this->index;
      puVar2[lVar3 + 1] = uVar1;
      lVar4 = lVar4 + 0x40;
      uVar1 = uVar1 + 0x10;
      lVar3 = lVar3 + 1;
    } while (lVar3 < (int)(i | 3));
  }
  return puVar2[i];
}

Assistant:

int32_t MutableCodePointTrie::getDataBlock(int32_t i) {
    if (flags[i] == MIXED) {
        return index[i];
    }
    if (i < BMP_I_LIMIT) {
        int32_t newBlock = allocDataBlock(UCPTRIE_FAST_DATA_BLOCK_LENGTH);
        if (newBlock < 0) { return newBlock; }
        int32_t iStart = i & ~(SMALL_DATA_BLOCKS_PER_BMP_BLOCK -1);
        int32_t iLimit = iStart + SMALL_DATA_BLOCKS_PER_BMP_BLOCK;
        do {
            U_ASSERT(flags[iStart] == ALL_SAME);
            writeBlock(data + newBlock, index[iStart]);
            flags[iStart] = MIXED;
            index[iStart++] = newBlock;
            newBlock += UCPTRIE_SMALL_DATA_BLOCK_LENGTH;
        } while (iStart < iLimit);
        return index[i];
    } else {
        int32_t newBlock = allocDataBlock(UCPTRIE_SMALL_DATA_BLOCK_LENGTH);
        if (newBlock < 0) { return newBlock; }
        writeBlock(data + newBlock, index[i]);
        flags[i] = MIXED;
        index[i] = newBlock;
        return newBlock;
    }
}